

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_hexdec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  jx9_value *pjVar2;
  byte *zSrc;
  ushort **ppuVar3;
  char in_CL;
  undefined7 in_register_00000009;
  byte *pbVar4;
  anon_union_8_3_18420de5_for_x aVar5;
  jx9_int64 iVal;
  int nLen;
  anon_union_8_3_18420de5_for_x local_30;
  int local_24;
  
  if (nArg < 1) {
    aVar5.iVal = -1;
  }
  else {
    local_30.rVal = 0.0;
    pjVar2 = *apArg;
    if ((pjVar2->iFlags & 1) == 0) {
      jx9MemObjToInteger(pjVar2);
      local_30 = pjVar2->x;
      aVar5 = local_30;
    }
    else {
      zSrc = (byte *)jx9_value_to_string(pjVar2,&local_24);
      aVar5 = local_30;
      if (0 < (long)local_24) {
        pbVar4 = zSrc + local_24;
        do {
          bVar1 = *zSrc;
          if ((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) {
            ppuVar3 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar1 * 2 + 1) & 0x10) != 0) {
              SyHexStrToInt64((char *)zSrc,(int)pbVar4 - (int)zSrc,&local_30,
                              (char **)CONCAT71(in_register_00000009,in_CL));
              aVar5 = local_30;
              break;
            }
          }
          else if (zSrc + 1 < pbVar4) {
            in_CL = -(zSrc[1] & 0xc0);
          }
          zSrc = zSrc + 1;
          aVar5 = local_30;
        } while (zSrc < pbVar4);
      }
    }
  }
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).iVal = (sxi64)aVar5;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_hexdec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		/* Delimit the string */
		zEnd = &zString[nLen];
		/* Ignore non hex-stream */
		while( zString < zEnd ){
			if( (unsigned char)zString[0] >= 0xc0 ){
				/* UTF-8 stream */
				zString++;
				while( zString < zEnd && (((unsigned char)zString[0] & 0xc0) == 0x80) ){
					zString++;
				}
			}else{
				if( SyisHex(zString[0]) ){
					break;
				}
				/* Ignore */
				zString++;
			}
		}
		if( zString < zEnd ){
			/* Cast */
			SyHexStrToInt64(zString, (sxu32)(zEnd-zString), (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}